

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O0

void bn_mul_recursive(unsigned_long *r,unsigned_long *a,unsigned_long *b,int n2,int dna,int dnb,
                     unsigned_long *t)

{
  int dna_00;
  int iVar1;
  int iVar2;
  int dnb_00;
  int iVar3;
  ulong uVar4;
  int in_ECX;
  unsigned_long *in_RDX;
  unsigned_long *in_RSI;
  ulong *in_RDI;
  int in_R8D;
  int in_R9D;
  unsigned_long *unaff_retaddr;
  ulong *in_stack_00000008;
  unsigned_long *p;
  unsigned_long lo;
  unsigned_long ln;
  uint zero;
  uint neg;
  int tnb;
  int tna;
  int c2;
  int c1;
  int n;
  unsigned_long *in_stack_00000328;
  unsigned_long *in_stack_00000330;
  unsigned_long *in_stack_00000338;
  undefined8 in_stack_ffffffffffffff98;
  unsigned_long *in_stack_ffffffffffffffa0;
  unsigned_long *in_stack_ffffffffffffffa8;
  ulong *puVar5;
  int dl;
  undefined8 in_stack_ffffffffffffffb0;
  int cl;
  unsigned_long *in_stack_ffffffffffffffb8;
  int iVar6;
  int in_stack_ffffffffffffffc4;
  int iVar7;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  dna_00 = in_ECX / 2;
  iVar1 = dna_00 + in_R8D;
  iVar2 = dna_00 + in_R9D;
  if (((in_ECX == 8) && (in_R8D == 0)) && (in_R9D == 0)) {
    bn_mul_comba8(in_stack_00000338,in_stack_00000330,in_stack_00000328);
  }
  else if (in_ECX < 0x10) {
    bn_mul_normal((unsigned_long *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  (unsigned_long *)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffc4,
                  in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (in_R8D + in_R9D < 0) {
      memset(in_RDI + (in_ECX * 2 + in_R8D + in_R9D),0,(long)-(in_R8D + in_R9D) << 3);
    }
  }
  else {
    dnb_00 = bn_cmp_part_words(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                               (int)in_stack_ffffffffffffff98);
    iVar3 = bn_cmp_part_words(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                              (int)in_stack_ffffffffffffff98);
    iVar7 = 0;
    iVar6 = 0;
    dl = (int)in_stack_ffffffffffffffb0;
    cl = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    switch(iVar3 + 4 + dnb_00 * 3) {
    case 0:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),(unsigned_long *)0x0,
                        in_stack_ffffffffffffffb8,cl,dl);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(iVar7,iVar6),in_stack_ffffffffffffffb8,
                        (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
      break;
    case 1:
      iVar6 = 1;
      break;
    case 2:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),(unsigned_long *)0x0,
                        in_stack_ffffffffffffffb8,cl,dl);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(iVar7,iVar6),in_stack_ffffffffffffffb8,
                        (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
      iVar7 = 1;
      break;
    case 3:
    case 4:
    case 5:
      iVar6 = 1;
      break;
    case 6:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),(unsigned_long *)0x0,
                        in_stack_ffffffffffffffb8,cl,dl);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(iVar7,iVar6),in_stack_ffffffffffffffb8,
                        (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
      iVar7 = 1;
      break;
    case 7:
      iVar6 = 1;
      break;
    case 8:
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),(unsigned_long *)0x0,
                        in_stack_ffffffffffffffb8,cl,dl);
      bn_sub_part_words((unsigned_long *)CONCAT44(iVar1,iVar2),
                        (unsigned_long *)CONCAT44(iVar7,iVar6),in_stack_ffffffffffffffb8,
                        (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
    }
    if (((dna_00 == 4) && (in_R8D == 0)) && (in_R9D == 0)) {
      if (iVar6 == 0) {
        bn_mul_comba4(_c2,_tnb,_zero);
      }
      else {
        memset(in_stack_00000008 + in_ECX,0,0x40);
      }
      bn_mul_comba4(_c2,_tnb,_zero);
      bn_mul_comba4(_c2,_tnb,_zero);
    }
    else if (((dna_00 == 8) && (in_R8D == 0)) && (in_R9D == 0)) {
      if (iVar6 == 0) {
        bn_mul_comba8(in_stack_00000338,in_stack_00000330,in_stack_00000328);
      }
      else {
        memset(in_stack_00000008 + in_ECX,0,0x80);
      }
      bn_mul_comba8(in_stack_00000338,in_stack_00000330,in_stack_00000328);
      bn_mul_comba8(in_stack_00000338,in_stack_00000330,in_stack_00000328);
    }
    else {
      if (iVar6 == 0) {
        bn_mul_recursive(in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,dna_00,dnb_00
                         ,unaff_retaddr);
      }
      else {
        memset(in_stack_00000008 + in_ECX,0,(long)in_ECX << 3);
      }
      bn_mul_recursive(in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,dna_00,dnb_00,
                       unaff_retaddr);
      bn_mul_recursive(in_RSI,in_RDX,(unsigned_long *)CONCAT44(in_ECX,in_R8D),in_R9D,dna_00,dnb_00,
                       unaff_retaddr);
    }
    uVar4 = bn_add_words(in_stack_00000008,in_RDI,in_RDI + in_ECX,in_ECX);
    iVar1 = (int)uVar4;
    if (iVar7 == 0) {
      uVar4 = bn_add_words(in_stack_00000008 + in_ECX,in_stack_00000008 + in_ECX,in_stack_00000008,
                           in_ECX);
      iVar1 = (int)uVar4 + iVar1;
    }
    else {
      uVar4 = bn_sub_words(in_stack_00000008 + in_ECX,in_stack_00000008,in_stack_00000008 + in_ECX,
                           in_ECX);
      iVar1 = iVar1 - (int)uVar4;
    }
    uVar4 = bn_add_words(in_RDI + dna_00,in_RDI + dna_00,in_stack_00000008 + in_ECX,in_ECX);
    iVar1 = (int)uVar4 + iVar1;
    if (iVar1 != 0) {
      puVar5 = in_RDI + (dna_00 + in_ECX);
      uVar4 = *puVar5;
      *puVar5 = uVar4 + (long)iVar1;
      if (uVar4 + (long)iVar1 < (ulong)(long)iVar1) {
        do {
          puVar5 = puVar5 + 1;
          uVar4 = *puVar5;
          *puVar5 = uVar4 + 1;
        } while (uVar4 + 1 == 0);
      }
    }
  }
  return;
}

Assistant:

void bn_mul_recursive(BN_ULONG *r, BN_ULONG *a, BN_ULONG *b, int n2,
                      int dna, int dnb, BN_ULONG *t)
{
    int n = n2 / 2, c1, c2;
    int tna = n + dna, tnb = n + dnb;
    unsigned int neg, zero;
    BN_ULONG ln, lo, *p;

# ifdef BN_MUL_COMBA
#  if 0
    if (n2 == 4) {
        bn_mul_comba4(r, a, b);
        return;
    }
#  endif
    /*
     * Only call bn_mul_comba 8 if n2 == 8 and the two arrays are complete
     * [steve]
     */
    if (n2 == 8 && dna == 0 && dnb == 0) {
        bn_mul_comba8(r, a, b);
        return;
    }
# endif                         /* BN_MUL_COMBA */
    /* Else do normal multiply */
    if (n2 < BN_MUL_RECURSIVE_SIZE_NORMAL) {
        bn_mul_normal(r, a, n2 + dna, b, n2 + dnb);
        if ((dna + dnb) < 0)
            memset(&r[2 * n2 + dna + dnb], 0,
                   sizeof(BN_ULONG) * -(dna + dnb));
        return;
    }
    /* r=(a[0]-a[1])*(b[1]-b[0]) */
    c1 = bn_cmp_part_words(a, &(a[n]), tna, n - tna);
    c2 = bn_cmp_part_words(&(b[n]), b, tnb, tnb - n);
    zero = neg = 0;
    switch (c1 * 3 + c2) {
    case -4:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        break;
    case -3:
        zero = 1;
        break;
    case -2:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n); /* + */
        neg = 1;
        break;
    case -1:
    case 0:
    case 1:
        zero = 1;
        break;
    case 2:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna); /* + */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        neg = 1;
        break;
    case 3:
        zero = 1;
        break;
    case 4:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna);
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n);
        break;
    }

# ifdef BN_MUL_COMBA
    if (n == 4 && dna == 0 && dnb == 0) { /* XXX: bn_mul_comba4 could take
                                           * extra args to do this well */
        if (!zero)
            bn_mul_comba4(&(t[n2]), t, &(t[n]));
        else
            memset(&t[n2], 0, sizeof(*t) * 8);

        bn_mul_comba4(r, a, b);
        bn_mul_comba4(&(r[n2]), &(a[n]), &(b[n]));
    } else if (n == 8 && dna == 0 && dnb == 0) { /* XXX: bn_mul_comba8 could
                                                  * take extra args to do
                                                  * this well */
        if (!zero)
            bn_mul_comba8(&(t[n2]), t, &(t[n]));
        else
            memset(&t[n2], 0, sizeof(*t) * 16);

        bn_mul_comba8(r, a, b);
        bn_mul_comba8(&(r[n2]), &(a[n]), &(b[n]));
    } else
# endif                         /* BN_MUL_COMBA */
    {
        p = &(t[n2 * 2]);
        if (!zero)
            bn_mul_recursive(&(t[n2]), t, &(t[n]), n, 0, 0, p);
        else
            memset(&t[n2], 0, sizeof(*t) * n2);
        bn_mul_recursive(r, a, b, n, 0, 0, p);
        bn_mul_recursive(&(r[n2]), &(a[n]), &(b[n]), n, dna, dnb, p);
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0]), c1 is the sign
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     */

    c1 = (int)(bn_add_words(t, r, &(r[n2]), n2));

    if (neg) {                  /* if t[32] is negative */
        c1 -= (int)(bn_sub_words(&(t[n2]), t, &(t[n2]), n2));
    } else {
        /* Might have a carry */
        c1 += (int)(bn_add_words(&(t[n2]), &(t[n2]), t, n2));
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0])+(a[0]*b[0])+(a[1]*b[1])
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     * c1 holds the carry bits
     */
    c1 += (int)(bn_add_words(&(r[n]), &(r[n]), &(t[n2]), n2));
    if (c1) {
        p = &(r[n + n2]);
        lo = *p;
        ln = (lo + c1) & BN_MASK2;
        *p = ln;

        /*
         * The overflow will stop before we over write words we should not
         * overwrite
         */
        if (ln < (BN_ULONG)c1) {
            do {
                p++;
                lo = *p;
                ln = (lo + 1) & BN_MASK2;
                *p = ln;
            } while (ln == 0);
        }
    }
}